

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus ProcessICCPChunk(ChunkData *chunk_data,WebPInfo *webp_info)

{
  long in_RSI;
  WebPInfoStatus local_4;
  
  if (*(int *)(in_RSI + 0x18) == 0) {
    if (*(int *)(in_RSI + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","ICCP chunk detected before VP8X chunk.");
    }
    local_4 = WEBP_INFO_PARSE_ERROR;
  }
  else if (((*(int *)(in_RSI + 0x10) == 0) && (*(int *)(in_RSI + 0x14) == 0)) &&
          (*(int *)(in_RSI + 0x20) == 0)) {
    *(int *)(in_RSI + 0x28) = *(int *)(in_RSI + 0x28) + 1;
    local_4 = WEBP_INFO_OK;
  }
  else {
    if (*(int *)(in_RSI + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","ICCP chunk detected after image data.");
    }
    local_4 = WEBP_INFO_PARSE_ERROR;
  }
  return local_4;
}

Assistant:

static WebPInfoStatus ProcessICCPChunk(const ChunkData* const chunk_data,
                                       WebPInfo* const webp_info) {
  (void)chunk_data;
  if (!webp_info->chunk_counts_[CHUNK_VP8X]) {
    LOG_ERROR("ICCP chunk detected before VP8X chunk.");
    return WEBP_INFO_PARSE_ERROR;
  }
  if (webp_info->chunk_counts_[CHUNK_VP8] ||
      webp_info->chunk_counts_[CHUNK_VP8L] ||
      webp_info->chunk_counts_[CHUNK_ANIM]) {
    LOG_ERROR("ICCP chunk detected after image data.");
    return WEBP_INFO_PARSE_ERROR;
  }
  ++webp_info->chunk_counts_[CHUNK_ICCP];
  return WEBP_INFO_OK;
}